

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::CartesianProductGenerator<int,_aom_rc_mode,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool dummy [3];
  bool at_end;
  bool local_39;
  __tuple_element_t<1UL,_tuple<ParamIterator<int>,_ParamIterator<aom_rc_mode>,_ParamIterator<int>_>_>
  *in_stack_ffffffffffffffc8;
  ParamIterator<int> *in_stack_ffffffffffffffd0;
  ParamIterator<aom_rc_mode> *this_00;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
              *)0x88d693);
  std::
  get<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
              *)0x88d6a6);
  local_b._2_1_ =
       ParamIterator<int>::operator==
                 (in_stack_ffffffffffffffd0,(ParamIterator<int> *)in_stack_ffffffffffffffc8);
  this_00 = (ParamIterator<aom_rc_mode> *)&local_b;
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    in_stack_ffffffffffffffc8 =
         std::
         get<1ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
                   ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
                     *)0x88d6f3);
    std::
    get<1ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
                *)0x88d706);
    local_21 = ParamIterator<aom_rc_mode>::operator==(this_00,in_stack_ffffffffffffffc8);
  }
  local_b._2_1_ = local_21;
  *(bool *)&(this_00->impl_)._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
            .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
            _M_head_impl = local_21;
  local_39 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<2ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
                *)0x88d757);
    std::
    get<2ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
                *)0x88d76a);
    local_39 = ParamIterator<int>::operator==
                         ((ParamIterator<int> *)this_00,
                          (ParamIterator<int> *)in_stack_ffffffffffffffc8);
  }
  return local_39;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }